

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PythonDataType.h
# Opt level: O0

Ref<anurbs::Polyline<2L>_> __thiscall
anurbs::PythonDataType<anurbs::Model,_anurbs::Polyline<2L>_>::replace
          (PythonDataType<anurbs::Model,_anurbs::Polyline<2L>_> *this,Model *self,size_t index,
          Pointer<anurbs::Polyline<2L>_> *data)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::Polyline<2L>_> RVar1;
  shared_ptr<anurbs::Polyline<2L>_> local_38;
  Pointer<anurbs::Polyline<2L>_> *local_28;
  Pointer<anurbs::Polyline<2L>_> *data_local;
  size_t index_local;
  Model *self_local;
  
  local_28 = data;
  data_local = (Pointer<anurbs::Polyline<2L>_> *)index;
  index_local = (size_t)self;
  self_local = (Model *)this;
  std::shared_ptr<anurbs::Polyline<2L>_>::shared_ptr(&local_38,data);
  Model::replace<anurbs::Polyline<2l>>
            ((Model *)this,(size_t)self,(Pointer<anurbs::Polyline<2L>_> *)index);
  std::shared_ptr<anurbs::Polyline<2L>_>::~shared_ptr(&local_38);
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Polyline<2L>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Polyline<2L>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (Ref<anurbs::Polyline<2L>_>)
         RVar1.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::Polyline<2L>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Ref<TData> replace(TModel& self, const size_t index,
        Pointer<TData> data)
    {
        return self.template replace<TData>(index, data);
    }